

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int MRIStepGetWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  MRIStepInnerStepper p_Var1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_28;
  ARKodeMem local_20;
  
  iVar2 = mriStep_AccessStepMem(arkode_mem,"MRIStepGetLastInnerStepFlag",&local_20,&local_28);
  if (iVar2 == 0) {
    iVar2 = arkGetWorkSpace(arkode_mem,lenrw,leniw);
    if (iVar2 == 0) {
      p_Var1 = local_28->stepper;
      *lenrw = *lenrw + p_Var1->lrw;
      *leniw = *leniw + p_Var1->liw;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int MRIStepGetWorkSpace(void *arkode_mem, long int *lenrw, long int *leniw)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepGetLastInnerStepFlag",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Get ARKODE workspace */
  retval = arkGetWorkSpace(arkode_mem, lenrw, leniw);
  if (retval) return retval;

  /* Get the inner stepper workspace */
  *lenrw += step_mem->stepper->lrw;
  *leniw += step_mem->stepper->liw;

  return(ARK_SUCCESS);
}